

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountCase::init
          (OutputCountCase *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  pointer piVar2;
  OutputCountShader *this_00;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  uint uVar5;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *pNVar8;
  MessageBuilder *this_01;
  OutputCountShader *pOVar9;
  ShaderProgramDeclaration *pSVar10;
  ostream *poVar11;
  size_t sVar12;
  InternalError *this_02;
  FragmentSource *c;
  OutputCountPatternSpec *pOVar13;
  char *spec;
  bool *pbVar14;
  long lVar15;
  int ndx;
  long lVar16;
  ContextType local_4c0;
  allocator<char> local_4bc;
  allocator<char> local_4bb;
  allocator<char> local_4ba;
  allocator<char> local_4b9;
  OutputCountShader *local_4b8;
  OutputCountShader *local_4b0;
  GLint maxComponents;
  ShaderProgramDeclaration *local_488;
  FragmentOutput local_47c;
  GLint maxVertices;
  GenericVecType local_458;
  int local_450 [8];
  int testVertices;
  GenericVecType local_410;
  string local_408;
  GeometrySource local_3e8;
  string local_3c8;
  string local_3a8;
  FragmentSource local_388;
  string local_368;
  string local_348;
  VertexSource local_328;
  string local_308 [32];
  GeometryToFragmentVarying local_2e8;
  VertexToGeometryVarying local_2e0;
  ostringstream str;
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  _Var7 = std::
          __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  iVar6 = *_Var7._M_current;
  maxVertices = 0;
  maxComponents = 0;
  testVertices = iVar6;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                       m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar3) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,"Tests require GL_EXT_geometry_shader extension or higher context version.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x9c0);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar4 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))(0x8de0,&maxVertices);
  iVar4 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x868))(0x8de1,&maxComponents);
  str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"GL_MAX_GEOMETRY_OUTPUT_VERTICES = ");
  std::ostream::operator<<(puVar1,maxVertices);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = ");
  std::ostream::operator<<(puVar1,maxComponents);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"Components per vertex = ");
  std::ostream::operator<<(puVar1,8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pOVar13 = &this->m_spec;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  local_4b8 = (OutputCountShader *)pOVar13;
  if (iVar6 == -1) {
    uVar5 = maxComponents / 8;
    if (maxVertices < maxComponents / 8) {
      uVar5 = maxVertices;
    }
    *(pOVar13->pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar5 & 0xfffffffe;
    if ((uVar5 & 0xfffffffe) == 0) {
      this_02 = (InternalError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,"Pattern size is invalid.",(allocator<char> *)&local_140);
      tcu::InternalError::InternalError(this_02,(string *)&str);
      __cxa_throw(this_02,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if (maxVertices < iVar6) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)&local_140,&testVertices);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ," output vertices required.");
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&str);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (maxComponents < iVar6 * 8) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_450[0] = iVar6 * 8;
      de::toString<int>((string *)&local_140,local_450);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ," output components required.");
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&str);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"Rendering ");
  std::ostream::operator<<
            (puVar1,(int)((ulong)((long)(this->m_spec).pattern.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->m_spec).pattern.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2));
  std::operator<<((ostream *)puVar1,
                  " row(s).\nOne geometry shader invocation generates one row.\nRow sizes:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  puVar1 = &str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  lVar16 = 0;
  for (lVar15 = 0;
      lVar15 < (int)((ulong)((long)(this->m_spec).pattern.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_spec).pattern.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2); lVar15 = lVar15 + 1) {
    str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Row ");
    std::ostream::operator<<(puVar1,(int)lVar15);
    std::operator<<((ostream *)puVar1,": ");
    this_01 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&str,
                         (int *)((long)(((_Vector_impl *)
                                        &(local_4b8->super_ShaderProgram).super_VertexShader.
                                         _vptr_VertexShader)->super__Vector_impl_data)._M_start +
                                lVar16));
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " vertices.");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    lVar16 = lVar16 + 4;
  }
  pOVar9 = (OutputCountShader *)operator_new(0x178);
  local_4b0 = pOVar9;
  local_4c0.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  (pOVar9->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e47480;
  (pOVar9->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e474b8;
  (pOVar9->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e474d0;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_450,"a_position",&local_4b9);
  std::__cxx11::string::string((string *)&testVertices,(string *)local_450);
  local_410 = GENERICVECTYPE_FLOAT;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<
                      (&local_140,(VertexAttribute *)&testVertices);
  std::__cxx11::string::string<std::allocator<char>>(local_308,"a_color",&local_4ba);
  std::__cxx11::string::string((string *)&maxVertices,local_308);
  local_458 = GENERICVECTYPE_FLOAT;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<
                      (pSVar10,(VertexAttribute *)&maxVertices);
  local_2e0.type = GENERICVECTYPE_FLOAT;
  local_2e0.flatshade = false;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_2e0);
  local_2e8.type = GENERICVECTYPE_FLOAT;
  local_2e8.flatshade = false;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_2e8);
  local_47c.type = GENERICVECTYPE_FLOAT;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_47c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_4bb);
  specializeShader(&local_348,&local_368,&local_4c0);
  std::__cxx11::string::string((string *)&local_328,(string *)&local_348);
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_4bc);
  specializeShader(&local_3a8,&local_3c8,&local_4c0);
  std::__cxx11::string::string((string *)&local_388,(string *)&local_3a8);
  c = &local_388;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,c);
  local_158.numOutputVertices =
       OutputCountShader::getPatternEmitCount(local_4b8,(OutputCountPatternSpec *)c);
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  local_158.numInvocations = 1;
  local_488 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,"${GLSL_VERSION_DECL}\n");
  std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,
                  "${GLSL_EXT_GEOMETRY_SHADER}");
  std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,"layout(points) in;\n");
  pOVar13 = (OutputCountPatternSpec *)0x18846c0;
  poVar11 = std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "layout(triangle_strip, max_vertices = ");
  OutputCountShader::getPatternEmitCount(local_4b8,pOVar13);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,") out;");
  std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar11 = std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp float rowHeight = 2.0 / float("
                           );
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  spec = ");\n\tconst highp float colWidth = 2.0 / float(";
  poVar11 = std::operator<<(poVar11,");\n\tconst highp float colWidth = 2.0 / float(");
  OutputCountShader::getPatternEmitCount(local_4b8,(OutputCountPatternSpec *)spec);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,");\n\n");
  std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,"\thighp int emitCount = "
                 );
  lVar15 = 0;
  while( true ) {
    piVar2 = (this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = ((long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2) * 0x40000000 + -0x100000000;
    if (lVar16 >> 0x20 <= lVar15) break;
    poVar11 = std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,
                              "(gl_PrimitiveIDIn == ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar15);
    poVar11 = std::operator<<(poVar11,") ? (");
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (poVar11,*(int *)((long)(local_4b8->super_ShaderProgram).super_VertexShader.
                                                _vptr_VertexShader + lVar15 * 4));
    std::operator<<(poVar11,") : (");
    lVar15 = lVar15 + 1;
  }
  poVar11 = (ostream *)std::ostream::operator<<(&str,*(int *)((long)piVar2 + (lVar16 >> 0x1e)));
  pbVar14 = (bool *)0x17263e7;
  if ((long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 4) {
    pbVar14 = glcts::fixed_sample_locations_values + 1;
  }
  poVar11 = std::operator<<(poVar11,pbVar14);
  std::operator<<(poVar11,";\n");
  std::operator<<(&str.super_basic_ostream<char,_std::char_traits<char>_>,
                  "\tfor (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n\t{\n\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n\t\tv_frag_FragColor = v_geom_FragColor[0];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n\t\tv_frag_FragColor = v_geom_FragColor[0];\n\t\tEmitVertex();\n\t}\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  specializeShader(&local_408,(string *)&maxComponents,&local_4c0);
  std::__cxx11::string::~string((string *)&maxComponents);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::__cxx11::string::string((string *)&local_3e8,(string *)&local_408);
  this_00 = local_4b0;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(local_488,&local_3e8);
  sglr::ShaderProgram::ShaderProgram(&this_00->super_ShaderProgram,pSVar10);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&maxVertices);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)&testVertices);
  std::__cxx11::string::~string((string *)local_450);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  pOVar9 = local_4b8;
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e47480;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e474b8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e474d0;
  *(int *)&(this_00->super_ShaderProgram).field_0x154 =
       (int)((ulong)((long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  sVar12 = OutputCountShader::getPatternEmitCount(local_4b8,(OutputCountPatternSpec *)pSVar10);
  this_00->m_patternMaxEmitCount = (int)sVar12;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this_00->m_spec).pattern,(vector<int,_std::allocator<int>_> *)pOVar9);
  this->m_program = this_00;
  iVar6 = GeometryShaderRenderTest::init
                    (&this->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pOVar9);
  return iVar6;
}

Assistant:

void OutputCountCase::init (void)
{
	// Check requirements and adapt to them
	{
		const int	componentsPerVertex	= 4 + 4; // vec4 pos, vec4 color
		const int	testVertices		= *std::max_element(m_spec.pattern.begin(), m_spec.pattern.end());
		glw::GLint	maxVertices			= 0;
		glw::GLint	maxComponents		= 0;

		// check the extension before querying anything
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
			TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_OUTPUT_VERTICES, &maxVertices);
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_OUTPUT_VERTICES = " << maxVertices << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = " << maxComponents << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Components per vertex = " << componentsPerVertex << tcu::TestLog::EndMessage;

		if (testVertices == -1)
		{
			// "max vertices"-case
			DE_ASSERT((int)m_spec.pattern.size() == 1);
			m_spec.pattern[0] = de::min(maxVertices, maxComponents / componentsPerVertex);

			// make sure size is dividable by 2, as OutputShader requires
			m_spec.pattern[0] = m_spec.pattern[0] & ~0x00000001;

			if (m_spec.pattern[0] == 0)
				throw tcu::InternalError("Pattern size is invalid.");
		}
		else
		{
			// normal case
			if (testVertices > maxVertices)
				throw tcu::NotSupportedError(de::toString(testVertices) + " output vertices required.");
			if (testVertices * componentsPerVertex > maxComponents)
				throw tcu::NotSupportedError(de::toString(testVertices * componentsPerVertex) + " output components required.");
		}
	}

	// Log what the test tries to do

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << (int)m_spec.pattern.size() << " row(s).\nOne geometry shader invocation generates one row.\nRow sizes:" << tcu::TestLog::EndMessage;
	for (int ndx = 0; ndx < (int)m_spec.pattern.size(); ++ndx)
		m_testCtx.getLog() << tcu::TestLog::Message << "Row " << ndx << ": " << m_spec.pattern[ndx] << " vertices." << tcu::TestLog::EndMessage;

	// Gen shader
	DE_ASSERT(!m_program);
	m_program = new OutputCountShader(m_context.getRenderContext().getType(), m_spec);

	// Case init
	GeometryShaderRenderTest::init();
}